

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftverify.c
# Opt level: O0

int ftverify_work(char *infile,char *outfile,int prehead,int prstat,char *errreport,int testdata,
                 int testcsum,int testfill,int heasarc_conv,int testhierarch)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  char local_218 [8];
  char msg [256];
  int nwarns;
  int nerrs;
  int i;
  float fversion;
  char tversion [80];
  char task [80];
  char *p;
  int filestatus;
  int vfstatus;
  int status;
  FILE *list;
  FILE *outfptr;
  int testdata_local;
  char *errreport_local;
  int prstat_local;
  int prehead_local;
  char *outfile_local;
  char *infile_local;
  
  _vfstatus = (FILE *)0x0;
  if ((*errreport == 's') || (*errreport == 'S')) {
    err_report = 2;
  }
  if ((*errreport == 'e') || (*errreport == 'E')) {
    err_report = 1;
  }
  if (*infile == '@') {
    _vfstatus = fopen(infile + 1,"r");
    if (_vfstatus == (FILE *)0x0) {
      fprintf(_stderr,"Cannot open the list file: %s.",infile + 1);
      leave_early((FILE *)0x0);
      return 0x68;
    }
  }
  headas_clobberfile(outfile);
  if ((((prstat == 0) || (sVar2 = strlen(outfile), sVar2 == 0)) ||
      (iVar1 = strcmp(outfile,"STDOUT"), iVar1 == 0)) ||
     ((iVar1 = strcmp(outfile,"STDERR"), iVar1 == 0 ||
      (__stream = fopen(outfile,"r"), __stream == (FILE *)0x0)))) {
    if ((prstat == 0) ||
       ((sVar2 = strlen(outfile), sVar2 != 0 && (iVar1 = strcmp(outfile,"STDOUT"), iVar1 != 0)))) {
      if ((prstat == 0) ||
         ((sVar2 = strlen(outfile), sVar2 != 0 && (iVar1 = strcmp(outfile,"STDERR"), iVar1 != 0))))
      {
        if (prstat == 0) {
          list = (FILE *)0x0;
        }
        else {
          list = (FILE *)fopen(outfile,"w");
          if ((FILE *)list == (FILE *)0x0) {
            fprintf(_stderr,"Error open output file %s. Using stdout instead.",outfile);
            list = _stdout;
          }
        }
      }
      else {
        list = (FILE *)_stderr;
      }
    }
    else {
      list = _stdout;
    }
    wrtout(list," ");
    ffvers(&nerrs);
    get_toolname(tversion + 0x48);
    get_toolversion((char *)&i);
    sprintf(comm,"%s %s (CFITSIO V%.3f)",(double)(float)nerrs,tversion + 0x48,&i);
    wrtsep(list,' ',comm,0x3c);
    for (nwarns = 0; comm[nwarns] != '\0'; nwarns = nwarns + 1) {
      comm[nwarns] = '-';
    }
    wrtsep(list,' ',comm,0x3c);
    wrtout(list," ");
    if (((err_report != 0) && (err_report != 1)) && (err_report == 2)) {
      sprintf(comm,"Caution: Only checking for the most severe FITS format errors.");
      wrtout(list,comm);
    }
    if (heasarc_conv != 0) {
      sprintf(comm,"HEASARC conventions are being checked.");
      wrtout(list,comm);
    }
    if (testhierarch != 0) {
      sprintf(comm,"ESO HIERARCH keywords are being checked.");
      wrtout(list,comm);
    }
    if (_vfstatus == (FILE *)0x0) {
      iVar1 = verify_fits(infile,list);
      if (list == (FILE *)0x0) {
        if (iVar1 == 0) {
          msg._252_4_ = get_total_err();
        }
        else {
          msg[0xfc] = '\x01';
          msg[0xfd] = '\0';
          msg[0xfe] = '\0';
          msg[0xff] = '\0';
        }
        msg._248_4_ = get_total_warn();
        if ((int)(msg._252_4_ + msg._248_4_) < 1) {
          printf("verification OK: %-20s\n",infile);
        }
        else if (err_report == 0) {
          printf("verification FAILED: %-20s, %d warnings and %d errors\n",infile,
                 (ulong)(uint)msg._248_4_,(ulong)(uint)msg._252_4_);
        }
        else {
          printf("verification FAILED: %-20s, %d errors\n",infile,(ulong)(uint)msg._252_4_);
        }
      }
    }
    else {
      while (pcVar3 = fgets(infile,0x401,_vfstatus), pcVar3 != (char *)0x0) {
        iVar1 = verify_fits(infile,list);
        if (list == (FILE *)0x0) {
          if (iVar1 == 0) {
            msg._252_4_ = get_total_err();
          }
          else {
            msg[0xfc] = '\x01';
            msg[0xfd] = '\0';
            msg[0xfe] = '\0';
            msg[0xff] = '\0';
          }
          msg._248_4_ = get_total_warn();
          if ((int)(msg._252_4_ + msg._248_4_) < 1) {
            printf("verification OK: %-20s\n",infile);
          }
          else if (err_report == 0) {
            printf("verification FAILED: %-20s, %d warnings and %d errors\n",infile,
                   (ulong)(uint)msg._248_4_,(ulong)(uint)msg._252_4_);
          }
          else {
            printf("verification FAILED: %-20s, %d errors\n",infile,(ulong)(uint)msg._252_4_);
          }
        }
        for (nwarns = 1; nwarns < 3; nwarns = nwarns + 1) {
          wrtout(list," ");
        }
      }
      fclose(_vfstatus);
    }
    if ((list != _stdout) && (list != (FILE *)0x0)) {
      fclose((FILE *)list);
    }
    infile_local._4_4_ = 0;
  }
  else {
    sprintf(local_218,"Clobber is not set. Cannot overwrite the file%s",outfile);
    HD_ERROR_THROW(local_218,0x69);
    leave_early((FILE *)0x0);
    fclose(__stream);
    infile_local._4_4_ = 0x69;
  }
  return infile_local._4_4_;
}

Assistant:

int ftverify_work(
    char *infile,   /* I - Input file name (Fits) */
    char *outfile,  /* I - Output file name (ASCII) */
    int  prehead,  
    int  prstat,
    char * errreport,
    int  testdata,
    int  testcsum,
    int  testfill,
    int  heasarc_conv,
    int  testhierarch)

/* call work function to verify that infile conforms to the FITS
       standard and write report to the output file */
{
#ifdef WEBTOOL
    FILE *runfile = 0;
    int runnum;
    char runchars[30];
#endif
    FILE *outfptr = 0;
    FILE *list=0;
    int status = 0, vfstatus = 0, filestatus;
    char * p;
    char task[80];
    char tversion[80];
    float fversion;
    int i, nerrs, nwarns;
    char msg[MAXMSG];

    /* determine 'Severe error", "Error", or "Warning" report level */
    if( *errreport == 's' || *errreport == 'S') err_report = 2;
    if( *errreport == 'e' || *errreport == 'E') err_report = 1;

    p = infile;
    if (*p == '@') {
         p++;
         if( (list = fopen(p,"r")) == NULL ) {
                fprintf(stderr,"Cannot open the list file: %s.",p);
                leave_early(NULL);
                return (FILE_NOT_OPENED);
         }
    }

    headas_clobberfile(outfile);  /* delete existing file if clobber=YES */
    p = outfile;

    /* test if writing output log to a disk file */
    if(prstat && strlen(p) && strcmp(p, "STDOUT") && strcmp(p, "STDERR")
      && (outfptr = fopen(p,"r") ) != NULL ) {
      sprintf(msg,"Clobber is not set. Cannot overwrite the file%s",p);
      status = FILE_NOT_CREATED;
      HD_ERROR_THROW(msg,status);
      leave_early(NULL);
      fclose(outfptr);
      return (status);
    }

    if(prstat && (!strlen(p) || !strcmp(p, "STDOUT"))) {
       outfptr = stdout;
    }
    else if(prstat && (!strlen(p) || !strcmp(p, "STDERR"))) {
       outfptr = stderr;
    }
    else if (!prstat) {
       outfptr=NULL;
    }  
    else if( (outfptr = fopen(p,"w") ) == NULL) {
       fprintf(stderr,"Error open output file %s. Using stdout instead.",
           outfile);
       outfptr = stdout;
    }

#ifdef WEBTOOL
    /* try opening and incrementing the file containing cumulative # of runs */
    runfile=fopen("/tmp.shared/fits/tmpverify/counter.fitsverify","r+"); 
/*    runfile=fopen("counter.fitsverify","r+"); */
    if (runfile) {
        fgets(runchars,20,runfile);
	runnum=atoi(runchars);
	runnum++;
	sprintf(comm,"                                           Run Number %d",runnum);
	wrtout(outfptr,comm);
        sprintf(runchars, "%d", runnum);
	fflush(runfile);
	rewind(runfile);
	fputs(runchars, runfile);
    }

#endif

    wrtout(outfptr," ");
    fits_get_version(&fversion);
    get_toolname(task); 
    get_toolversion(tversion); 
    sprintf(comm,"%s %s (CFITSIO V%.3f)",task,tversion,fversion);
    wrtsep(outfptr,' ',comm,60);
    for(i = 0; comm[i]!='\0'; i++) comm[i] = '-';
    wrtsep(outfptr,' ',comm,60);
    wrtout(outfptr," ");
    switch (err_report) {
    case 2:
    sprintf(comm, "Caution: Only checking for the most severe FITS format errors.");
        wrtout(outfptr,comm);
        break;
    case 1:
        break;
    case 0:
        break;
    }

    if(heasarc_conv) {
        sprintf(comm, "HEASARC conventions are being checked.");
        wrtout(outfptr,comm);
    }

    if(testhierarch) {
        sprintf(comm, "ESO HIERARCH keywords are being checked.");
        wrtout(outfptr,comm);
    }

    /* process each file */
    if (list == NULL) {
        vfstatus = verify_fits(infile,outfptr);

        if (outfptr == NULL) {  /* print one-line file summary */

           /* verify_fits returns a non-zero status for catastrophic
            * file I/O problems (an abort), and in this case total_err
            * is not updated via close_report(), so we need to set
            * nerrs accordingly for the one-line file summary. */
           if (vfstatus) nerrs = 1; else nerrs = get_total_err();

           nwarns = get_total_warn();

           filestatus = ((nerrs+nwarns)>0) ? 1 : 0;
	   if (filestatus)
	   {
	     if (err_report)
                printf("verification FAILED: %-20s, %d errors\n", 
	           infile, nerrs);
             else 
                printf("verification FAILED: %-20s, %d warnings and %d errors\n", 
	           infile, nwarns, nerrs);
           }
	   else
             printf("verification OK: %-20s\n", infile);
        }        
    }
    else {
       while((p = fgets(infile, FLEN_FILENAME, list))!= NULL) {
           vfstatus = verify_fits(infile,outfptr);

           if (outfptr == NULL) { /* print one-line file summary */

              /* verify_fits returns a non-zero status for catastrophic
               * file I/O problems (an abort), and in this case total_err
               * is not updated via close_report(), so we need to set
               * nerrs accordingly for the one-line file summary. */
              if (vfstatus) nerrs = 1; else nerrs = get_total_err();

              nwarns = get_total_warn();

              filestatus = ((nerrs+nwarns) >0) ? 1 : 0;
	      if (filestatus)
	      {
	        if (err_report)
                   printf("verification FAILED: %-20s, %d errors\n", 
	              infile, nerrs);
                else 
                   printf("verification FAILED: %-20s, %d warnings and %d errors\n", 
	              infile, nwarns, nerrs);
              }
              else
                 printf("verification OK: %-20s\n", infile);
           }        

           for (i = 1; i < 3; i++) wrtout(outfptr," ");
       }
       fclose(list);
    }

    /* close the output file  */ 
    if (outfptr != stdout && outfptr != NULL) fclose(outfptr);

    return(status);
}